

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_service.h
# Opt level: O3

t_function * __thiscall t_service::get_function_by_name(t_service *this,string *func_name)

{
  t_service *this_00;
  pointer pcVar1;
  pointer pptVar2;
  size_t __n;
  int iVar3;
  t_function *ptVar4;
  pointer pptVar5;
  string local_48;
  
  this_00 = this->extends_;
  if (this_00 != (t_service *)0x0) {
    pcVar1 = (func_name->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + func_name->_M_string_length);
    ptVar4 = get_function_by_name(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (ptVar4 != (t_function *)0x0) {
      return ptVar4;
    }
  }
  pptVar5 = (this->functions_).super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (this->functions_).super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pptVar5 != pptVar2) {
    __n = func_name->_M_string_length;
    do {
      ptVar4 = *pptVar5;
      if ((ptVar4->name_)._M_string_length == __n) {
        if (__n == 0) {
          return ptVar4;
        }
        iVar3 = bcmp((ptVar4->name_)._M_dataplus._M_p,(func_name->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) {
          return ptVar4;
        }
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 != pptVar2);
  }
  return (t_function *)0x0;
}

Assistant:

t_function* get_function_by_name(std::string func_name) {
    if (extends_ != NULL) {
      t_function* func = NULL;
      if ((func = extends_->get_function_by_name(func_name)) != NULL) {
        return func;
      }
    }

    std::vector<t_function*>::const_iterator iter;
    for (iter = functions_.begin(); iter != functions_.end(); ++iter) {
      if ((*iter)->get_name() == func_name) {
        return *iter;
      }
    }
    return NULL;
  }